

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O3

AVSValue __thiscall
AVSInterface::Create<TMedian>
          (AVSInterface *this,AVSValue *args,void *user_data,IScriptEnvironment *env)

{
  AVSWrapper<TMedian> *this_00;
  code *pcVar1;
  anon_union_8_9_d3d94a0b_for_AVSValue_2 extraout_RDX;
  anon_union_8_9_d3d94a0b_for_AVSValue_2 extraout_RDX_00;
  anon_union_8_9_d3d94a0b_for_AVSValue_2 aVar2;
  long *plVar3;
  AVSValue AVar4;
  AVSValue AStack_38;
  
  this_00 = (AVSWrapper<TMedian> *)operator_new(0x100);
  if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x4d8 < (uint)AVS_linkage->Size)) {
    pcVar1 = (code *)AVS_linkage->AVSValue_CONSTRUCTOR9;
    plVar3 = (long *)((long)&AStack_38.type + *(long *)&AVS_linkage->field_0x4e0);
    if (((ulong)pcVar1 & 1) != 0) {
      pcVar1 = *(code **)(pcVar1 + *plVar3 + -1);
    }
    (*pcVar1)(plVar3,args);
  }
  AVSWrapper<TMedian>::AVSWrapper(this_00,&AStack_38,env);
  AVSValue::~AVSValue(&AStack_38);
  AVSWrapper<TMedian>::Initialize(this_00);
  aVar2 = extraout_RDX;
  if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x458 < (uint)AVS_linkage->Size)) {
    pcVar1 = (code *)AVS_linkage->AVSValue_CONSTRUCTOR1;
    if (((ulong)pcVar1 & 1) != 0) {
      pcVar1 = *(code **)(pcVar1 + *(long *)(this + *(long *)&AVS_linkage->field_0x460) + -1);
    }
    (*pcVar1)(this + *(long *)&AVS_linkage->field_0x460,this_00);
    aVar2 = extraout_RDX_00;
  }
  AVar4.field_2.clip = aVar2.clip;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

AVSValue __cdecl Create(AVSValue args, void* user_data, IScriptEnvironment* env)
  {
    auto filter = new AVSWrapper<FilterType>(args, env);
    try {
      filter->Initialize();
    }
    catch (const char *err) {
      env->ThrowError("%s: %s", filter->data.AVSName(), err);
    }
    return filter;
  }